

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_arm.c
# Opt level: O3

cpu_purpose_t cpuid_identify_purpose_arm(cpu_raw_data_t *raw)

{
  uint *puVar1;
  uint uVar2;
  arm_hw_impl *paVar3;
  int iVar4;
  arm_hw_impl *paVar5;
  cpu_purpose_t cVar6;
  char **ppcVar7;
  
  uVar2 = (uint)raw->arm_midr;
  paVar3 = hw_implementer;
  do {
    paVar5 = paVar3;
    if (paVar5->id < 0) break;
    paVar3 = paVar5 + 1;
  } while (paVar5->id != uVar2 >> 0x18);
  ppcVar7 = &paVar5->parts[-1].name;
  do {
    puVar1 = (uint *)(ppcVar7 + 2);
    ppcVar7 = ppcVar7 + 3;
    if ((int)*puVar1 < 0) break;
  } while (*puVar1 != (uVar2 >> 4 & 0xfff));
  iVar4 = match_pattern(*ppcVar7,"Cortex-X[012356789]");
  cVar6 = PURPOSE_U_PERFORMANCE;
  if (iVar4 == 0) {
    iVar4 = match_pattern(*ppcVar7,"Cortex-A[67][012356789]");
    cVar6 = PURPOSE_PERFORMANCE;
    if (iVar4 == 0) {
      iVar4 = match_pattern(*ppcVar7,"Cortex-A[5][6789]");
      if (iVar4 == 0) {
        iVar4 = match_pattern(*ppcVar7,"Cortex-A[5][012345]");
        cVar6 = PURPOSE_EFFICIENCY;
        if (iVar4 == 0) {
          iVar4 = match_pattern(*ppcVar7,"Cortex-A[3][0123456789]");
          cVar6 = (uint)(iVar4 != 0) * 2;
        }
      }
    }
  }
  return cVar6;
}

Assistant:

cpu_purpose_t cpuid_identify_purpose_arm(struct cpu_raw_data_t* raw)
{
	const uint8_t implementer         = EXTRACTS_BITS(raw->arm_midr, 31, 24);
	const uint16_t part_num           = EXTRACTS_BITS(raw->arm_midr, 15,  4);
	const struct arm_hw_impl* hw_impl = get_cpu_implementer_from_code(implementer);
	const struct arm_id_part* id_part = get_cpu_implementer_parts(hw_impl, part_num);

	/* ARM big.LITTLE Typical Processor Combinations: https://www.arm.com/technologies/big-little */
	if (match_pattern(id_part->name, "Cortex-X[012356789]"))
		return PURPOSE_U_PERFORMANCE;
	else if (match_pattern(id_part->name, "Cortex-A[67][012356789]") || match_pattern(id_part->name, "Cortex-A[5][6789]"))
		return PURPOSE_PERFORMANCE;
	else if (match_pattern(id_part->name, "Cortex-A[5][012345]") || match_pattern(id_part->name, "Cortex-A[3][0123456789]"))
		return PURPOSE_EFFICIENCY;

	return PURPOSE_GENERAL;
}